

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

bool __thiscall
kj::anon_unknown_9::DiskHandle::tryCommitReplacement
          (DiskHandle *this,StringPtr toPath,int fromDirFd,StringPtr fromPath,WriteMode mode,
          int *errorReason)

{
  StringPtr toPath_00;
  StringPtr fromPath_00;
  PathPtr finalName;
  bool bVar1;
  Iface *pIVar2;
  String *pSVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  char *pcVar9;
  char *__old;
  byte unaff_R14B;
  ulong unaff_R15;
  StringPtr path;
  StringPtr path_00;
  StringPtr path_01;
  StringPtr toPath_local;
  StringPtr fromPath_local;
  String away;
  Function<int_(kj::StringPtr)> local_108;
  Path toPathParsed;
  Fault f_6;
  Fault f_5;
  Fault f;
  uint local_a8;
  
  fromPath_local.content.size_ = fromPath.content.size_;
  fromPath_local.content.ptr = fromPath.content.ptr;
  toPath_local.content.size_ = toPath.content.size_;
  toPath_local.content.ptr = toPath.content.ptr;
  if ((~mode & 3) == 0) {
    do {
      iVar4 = renameat(fromDirFd,fromPath_local.content.ptr,(this->fd).fd,toPath_local.content.ptr);
      if (-1 < iVar4) {
        unaff_R15 = 0;
        goto LAB_0048ec1a;
      }
      uVar5 = kj::_::Debug::getOsErrorNumber(false);
    } while (uVar5 == 0xffffffff);
    unaff_R15 = (ulong)uVar5;
LAB_0048ec1a:
    uVar5 = (uint)unaff_R15;
    unaff_R14B = uVar5 == 0;
    if ((bool)unaff_R14B) goto LAB_0048f3cd;
    if ((0x27 < uVar5) || ((0x8000320000U >> (unaff_R15 & 0x3f) & 1) == 0)) {
      if (errorReason == (int *)0x0) {
        kj::_::Debug::Fault::Fault<int,kj::StringPtr&,kj::StringPtr&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x440,uVar5,"rename(fromPath, toPath)","fromPath, toPath",&fromPath_local,
                   &toPath_local);
        kj::_::Debug::Fault::~Fault(&f);
      }
      else {
        *errorReason = uVar5;
      }
      goto LAB_0048f3cd;
    }
  }
  if ((mode & MODIFY) == 0) {
    if ((mode & CREATE) != 0) {
      do {
        lVar6 = syscall(0x13c,(ulong)(uint)fromDirFd,fromPath_local.content.ptr,
                        (ulong)(uint)(this->fd).fd,toPath_local.content.ptr,1);
        if (-1 < lVar6) {
          unaff_R15 = 0;
          goto LAB_0048ed7b;
        }
        uVar5 = kj::_::Debug::getOsErrorNumber(false);
      } while (uVar5 == 0xffffffff);
      unaff_R15 = (ulong)uVar5;
LAB_0048ed7b:
      iVar4 = (int)unaff_R15;
      if (iVar4 < 0x16) {
        if (iVar4 == 0) {
          unaff_R14B = 1;
          bVar1 = false;
        }
        else {
          if (iVar4 != 0x11) goto LAB_0048eda8;
LAB_0048eee6:
          bVar1 = false;
          unaff_R14B = 0;
        }
      }
      else {
        bVar1 = true;
        if ((iVar4 != 0x16) && (iVar4 != 0x26)) {
LAB_0048eda8:
          if (errorReason == (int *)0x0) {
            kj::_::Debug::Fault::Fault<int,kj::StringPtr&,kj::StringPtr&>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                       ,0x47f,iVar4,"renameat2(fromPath, toPath, NOREPLACE)","fromPath, toPath",
                       &fromPath_local,&toPath_local);
            kj::_::Debug::Fault::~Fault(&f);
          }
          else {
            *errorReason = iVar4;
          }
          goto LAB_0048eee6;
        }
      }
      goto joined_r0x0048ee4e;
    }
  }
  else {
    do {
      uVar7 = (ulong)(uint)(this->fd).fd;
      lVar6 = syscall(0x13c,(ulong)(uint)fromDirFd,fromPath_local.content.ptr,uVar7,
                      toPath_local.content.ptr,2);
      if (-1 < lVar6) {
        unaff_R15 = 0;
        goto LAB_0048ecce;
      }
      uVar5 = kj::_::Debug::getOsErrorNumber(false);
    } while (uVar5 == 0xffffffff);
    unaff_R15 = (ulong)uVar5;
LAB_0048ecce:
    iVar4 = (int)unaff_R15;
    if (iVar4 < 0x16) {
      if (iVar4 == 0) {
        path.content.size_ = uVar7;
        path.content.ptr = (char *)fromPath_local.content.size_;
        rmrf((anon_unknown_9 *)(ulong)(uint)fromDirFd,(int)fromPath_local.content.ptr,path);
        unaff_R14B = 1;
        bVar1 = false;
      }
      else {
        if (iVar4 != 2) goto LAB_0048ed5f;
        if ((mode & CREATE) != 0) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,char_const(&)[122],kj::StringPtr&,kj::StringPtr&>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x460,FAILED,(char *)0x0,
                     "\"rename(tmp, path) claimed path exists but \" \"renameat2(fromPath, toPath, EXCHANGE) said it doesn\'t; concurrent modification?\", fromPath, toPath"
                     ,(char (*) [122])
                      "rename(tmp, path) claimed path exists but renameat2(fromPath, toPath, EXCHANGE) said it doesn\'t; concurrent modification?"
                     ,&fromPath_local,&toPath_local);
          kj::_::Debug::Fault::~Fault(&f);
        }
LAB_0048ee40:
        bVar1 = false;
        unaff_R14B = 0;
      }
    }
    else {
      bVar1 = true;
      if ((iVar4 != 0x16) && (iVar4 != 0x26)) {
LAB_0048ed5f:
        if (errorReason == (int *)0x0) {
          kj::_::Debug::Fault::Fault<int,kj::StringPtr&,kj::StringPtr&>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x467,iVar4,"renameat2(fromPath, toPath, EXCHANGE)","fromPath, toPath",
                     &fromPath_local,&toPath_local);
          kj::_::Debug::Fault::~Fault(&f);
        }
        else {
          *errorReason = iVar4;
        }
        goto LAB_0048ee40;
      }
    }
joined_r0x0048ee4e:
    if (!bVar1) goto LAB_0048f3cd;
  }
  if ((~mode & 3) == 0) {
    do {
      sVar8 = 0x100;
      iVar4 = fstatat64((this->fd).fd,toPath_local.content.ptr,(stat64 *)&f,0x100);
      if (-1 < iVar4) {
        iVar4 = 0;
        break;
      }
      iVar4 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar4 == -1);
    if (iVar4 == 0) {
      path_00.content.size_ = sVar8;
      path_00.content.ptr = (char *)toPath_local.content.size_;
      Path::parse(&toPathParsed,(Path *)toPath_local.content.ptr,path_00);
      finalName.parts.size_ = toPathParsed.parts.size_;
      finalName.parts.ptr = toPathParsed.parts.ptr;
      local_108.impl.ptr = (Iface *)operator_new(0x18);
      (local_108.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0064c788;
      local_108.impl.ptr[1]._vptr_Iface = (_func_int **)&f;
      local_108.impl.ptr[2]._vptr_Iface = (_func_int **)this;
      local_108.impl.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::tryCommitReplacement(kj::StringPtr,int,kj::StringPtr,kj::WriteMode,int*)const::{lambda(kj::StringPtr)#1}>>
            ::instance;
      createNamedTemporary(&away,this,finalName,CREATE,&local_108);
      pIVar2 = local_108.impl.ptr;
      if (local_108.impl.ptr != (Iface *)0x0) {
        local_108.impl.ptr = (Iface *)0x0;
        (**(local_108.impl.disposer)->_vptr_Disposer)
                  (local_108.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
      }
      do {
        pcVar9 = "";
        if (away.content.size_ != 0) {
          pcVar9 = away.content.ptr;
        }
        iVar4 = (this->fd).fd;
        iVar4 = renameat(iVar4,toPath_local.content.ptr,iVar4,pcVar9);
        if (-1 < iVar4) {
          iVar4 = 0;
          break;
        }
        iVar4 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar4 == -1);
      if (iVar4 != 0) {
        f_5.exception = (Exception *)0x0;
        f_6.exception = (Exception *)0x0;
        kj::_::Debug::Fault::init
                  (&f_5,(EVP_PKEY_CTX *)
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                  );
        pcVar9 = "";
        if (away.content.size_ != 0) {
          pcVar9 = away.content.ptr;
        }
        unlinkat((this->fd).fd,pcVar9,(uint)((local_a8 & 0xf000) == 0x4000) << 9);
        kj::_::Debug::Fault::~Fault(&f_5);
        unaff_R14B = 0;
      }
      if (iVar4 == 0) {
        do {
          pcVar9 = toPath_local.content.ptr;
          iVar4 = renameat(fromDirFd,fromPath_local.content.ptr,(this->fd).fd,
                           toPath_local.content.ptr);
          if (-1 < iVar4) {
            uVar5 = 0;
            break;
          }
          uVar5 = kj::_::Debug::getOsErrorNumber(false);
        } while (uVar5 == 0xffffffff);
        if (uVar5 != 0) {
          do {
            __old = "";
            if (away.content.size_ != 0) {
              __old = away.content.ptr;
            }
            iVar4 = (this->fd).fd;
            pcVar9 = toPath_local.content.ptr;
            iVar4 = renameat(iVar4,__old,iVar4,toPath_local.content.ptr);
          } while ((iVar4 < 0) && (iVar4 = kj::_::Debug::getOsErrorNumber(false), iVar4 == -1));
          if (errorReason == (int *)0x0) {
            pcVar9 = (char *)(ulong)uVar5;
            kj::_::Debug::Fault::Fault<int,kj::StringPtr&,kj::StringPtr&>
                      (&f_6,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                       ,0x4be,uVar5,"rename(fromPath, toPath)","fromPath, toPath",&fromPath_local,
                       &toPath_local);
            kj::_::Debug::Fault::~Fault(&f_6);
          }
          else {
            *errorReason = uVar5;
          }
          unaff_R14B = 0;
        }
        if (uVar5 == 0) {
          if (away.content.size_ == 0) {
            iVar4 = 0x4d2b65;
          }
          else {
            iVar4 = (int)away.content.ptr;
          }
          path_01.content.ptr = (char *)(away.content.size_ + (away.content.size_ == 0));
          unaff_R14B = 1;
          path_01.content.size_ = (size_t)pcVar9;
          rmrf((anon_unknown_9 *)(ulong)(uint)(this->fd).fd,iVar4,path_01);
        }
      }
      sVar8 = away.content.size_;
      pcVar9 = away.content.ptr;
      if (away.content.ptr != (char *)0x0) {
        away.content.ptr = (char *)0x0;
        away.content.size_ = 0;
        (**(away.content.disposer)->_vptr_ArrayDisposer)
                  (away.content.disposer,pcVar9,1,sVar8,sVar8,0);
      }
      sVar8 = toPathParsed.parts.size_;
      pSVar3 = toPathParsed.parts.ptr;
      if (toPathParsed.parts.ptr != (String *)0x0) {
        toPathParsed.parts.ptr = (String *)0x0;
        toPathParsed.parts.size_ = 0;
        (**(toPathParsed.parts.disposer)->_vptr_ArrayDisposer)
                  (toPathParsed.parts.disposer,pSVar3,0x18,sVar8,sVar8,
                   ArrayDisposer::Dispose_<kj::String>::destruct);
      }
    }
    else {
      away.content.ptr = (char *)0x0;
      toPathParsed.parts.ptr = (String *)0x0;
      toPathParsed.parts.size_ = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&away,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::~Fault((Fault *)&away);
      unaff_R14B = 0;
    }
    goto LAB_0048f3cd;
  }
  if ((mode & CREATE) == 0) {
    if ((mode & MODIFY) == 0) {
      unaff_R14B = 0;
      goto LAB_0048f3cd;
    }
    do {
      iVar4 = fstatat64((this->fd).fd,toPath_local.content.ptr,(stat64 *)&f,0x100);
      if (-1 < iVar4) {
        iVar4 = 0;
        break;
      }
      uVar5 = kj::_::Debug::getOsErrorNumber(false);
      unaff_R15 = unaff_R15 & 0xffffffff;
      if (uVar5 != 0xffffffff) {
        unaff_R15 = (ulong)uVar5;
      }
      iVar4 = (int)unaff_R15;
    } while (uVar5 == 0xffffffff);
    if (((iVar4 != 0) && (unaff_R14B = 0, iVar4 != 2)) && (iVar4 != 0x14)) {
      kj::_::Debug::Fault::Fault<int,kj::StringPtr&>
                ((Fault *)&toPathParsed,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x4df,iVar4,"fstatat(fd, toPath)","toPath",&toPath_local);
      kj::_::Debug::Fault::~Fault((Fault *)&toPathParsed);
      unaff_R14B = 0;
    }
    if (iVar4 != 0) goto LAB_0048f3cd;
  }
  else {
    do {
      iVar4 = fstatat64((this->fd).fd,toPath_local.content.ptr,(stat64 *)&f,0x100);
      if (-1 < iVar4) {
        iVar4 = 0;
        break;
      }
      uVar5 = kj::_::Debug::getOsErrorNumber(false);
      unaff_R15 = unaff_R15 & 0xffffffff;
      if (uVar5 != 0xffffffff) {
        unaff_R15 = (ulong)uVar5;
      }
      iVar4 = (int)unaff_R15;
    } while (uVar5 == 0xffffffff);
    if (iVar4 == 0) {
LAB_0048f0f9:
      bVar1 = false;
      unaff_R14B = 0;
    }
    else {
      bVar1 = true;
      if ((iVar4 != 2) && (iVar4 != 0x14)) {
        kj::_::Debug::Fault::Fault<int,kj::StringPtr&>
                  ((Fault *)&toPathParsed,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x4d4,iVar4,"fstatat(fd, toPath)","toPath",&toPath_local);
        kj::_::Debug::Fault::~Fault((Fault *)&toPathParsed);
        goto LAB_0048f0f9;
      }
    }
    if (!bVar1) goto LAB_0048f3cd;
  }
  toPath_00.content.size_ = toPath_local.content.size_;
  toPath_00.content.ptr = toPath_local.content.ptr;
  fromPath_00.content.size_ = fromPath_local.content.size_;
  fromPath_00.content.ptr = fromPath_local.content.ptr;
  unaff_R14B = tryCommitReplacement(this,toPath_00,fromDirFd,fromPath_00,MODIFY|CREATE,errorReason);
LAB_0048f3cd:
  return (bool)(unaff_R14B & 1);
}

Assistant:

bool tryCommitReplacement(StringPtr toPath, int fromDirFd, StringPtr fromPath, WriteMode mode,
                            int* errorReason = nullptr) const {
    if (has(mode, WriteMode::CREATE) && has(mode, WriteMode::MODIFY)) {
      // Always clobber. Try it.
      KJ_SYSCALL_HANDLE_ERRORS(renameat(fromDirFd, fromPath.cStr(), fd.get(), toPath.cStr())) {
        case EISDIR:
        case ENOTDIR:
        case ENOTEMPTY:
        case EEXIST:
          // Failed because target exists and due to the various weird quirks of rename(), it
          // can't remove it for us. On Linux we can try an exchange instead. On others we have
          // to move the target out of the way.
          break;
        default:
          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) { return false; }
          } else {
            *errorReason = error;
            return false;
          }
      } else {
        return true;
      }
    }

#if __linux__ && defined(RENAME_EXCHANGE) && defined(SYS_renameat2)
    // Try to use Linux's renameat2() to atomically check preconditions and apply.

    if (has(mode, WriteMode::MODIFY)) {
      // Use an exchange to implement modification.
      //
      // We reach this branch when performing a MODIFY-only, or when performing a CREATE | MODIFY
      // in which we determined above that there's a node of a different type blocking the
      // exchange.

      KJ_SYSCALL_HANDLE_ERRORS(syscall(SYS_renameat2,
          fromDirFd, fromPath.cStr(), fd.get(), toPath.cStr(), RENAME_EXCHANGE)) {
        case ENOSYS:  // Syscall not supported by kernel.
        case EINVAL:  // Maybe we screwed up, or maybe the syscall is not supported by the
                      // filesystem. Unfortunately, there's no way to tell, so assume the latter.
                      // ZFS in particular apparently produces EINVAL.
          break;  // fall back to traditional means
        case ENOENT:
          // Presumably because the target path doesn't exist.
          if (has(mode, WriteMode::CREATE)) {
            KJ_FAIL_ASSERT("rename(tmp, path) claimed path exists but "
                "renameat2(fromPath, toPath, EXCHANGE) said it doesn't; concurrent modification?",
                fromPath, toPath) { return false; }
          } else {
            // Assume target doesn't exist.
            return false;
          }
        default:
          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("renameat2(fromPath, toPath, EXCHANGE)", error, fromPath, toPath) {
              return false;
            }
          } else {
            *errorReason = error;
            return false;
          }
      } else {
        // Successful swap! Delete swapped-out content.
        rmrf(fromDirFd, fromPath);
        return true;
      }
    } else if (has(mode, WriteMode::CREATE)) {
      KJ_SYSCALL_HANDLE_ERRORS(syscall(SYS_renameat2,
          fromDirFd, fromPath.cStr(), fd.get(), toPath.cStr(), RENAME_NOREPLACE)) {
        case ENOSYS:  // Syscall not supported by kernel.
        case EINVAL:  // Maybe we screwed up, or maybe the syscall is not supported by the
                      // filesystem. Unfortunately, there's no way to tell, so assume the latter.
                      // ZFS in particular apparently produces EINVAL.
          break;  // fall back to traditional means
        case EEXIST:
          return false;
        default:
          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("renameat2(fromPath, toPath, NOREPLACE)", error, fromPath, toPath) {
              return false;
            }
          } else {
            *errorReason = error;
            return false;
          }
      } else {
        return true;
      }
    }
#endif

    // We're unable to do what we wanted atomically. :(

    if (has(mode, WriteMode::CREATE) && has(mode, WriteMode::MODIFY)) {
      // We failed to atomically delete the target previously. So now we need to do two calls in
      // rapid succession to move the old file away then move the new one into place.

      // Find out what kind of file exists at the target path.
      struct stat stats;
      KJ_SYSCALL(fstatat(fd, toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) { return false; }

      // Create a temporary location to move the existing object to. Note that rename() allows a
      // non-directory to replace a non-directory, and allows a directory to replace an empty
      // directory. So we have to create the right type.
      Path toPathParsed = Path::parse(toPath);
      String away = createNamedTemporary(toPathParsed, WriteMode::CREATE,
          [&](StringPtr candidatePath) {
        if (S_ISDIR(stats.st_mode)) {
          return mkdirat(fd, candidatePath.cStr(), 0700);
        } else {
#if __APPLE__ || __FreeBSD__
          // - No mknodat() on OSX, gotta open() a file, ugh.
          // - On a modern FreeBSD, mknodat() is reserved strictly for device nodes,
          //   you cannot create a regular file using it (EINVAL).
          int newFd = openat(fd, candidatePath.cStr(),
                             O_RDWR | O_CREAT | O_EXCL | MAYBE_O_CLOEXEC, 0700);
          if (newFd >= 0) close(newFd);
          return newFd;
#else
          return mknodat(fd, candidatePath.cStr(), S_IFREG | 0600, dev_t());
#endif
        }
      });

      // OK, now move the target object to replace the thing we just created.
      KJ_SYSCALL(renameat(fd, toPath.cStr(), fd, away.cStr())) {
        // Something went wrong. Remove the thing we just created.
        unlinkat(fd, away.cStr(), S_ISDIR(stats.st_mode) ? AT_REMOVEDIR : 0);
        return false;
      }

      // Now move the source object to the target location.
      KJ_SYSCALL_HANDLE_ERRORS(renameat(fromDirFd, fromPath.cStr(), fd, toPath.cStr())) {
        default:
          // Try to put things back where they were. If this fails, though, then we have little
          // choice but to leave things broken.
          KJ_SYSCALL_HANDLE_ERRORS(renameat(fd, away.cStr(), fd, toPath.cStr())) {
            default: break;
          }

          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) {
              return false;
            }
          } else {
            *errorReason = error;
            return false;
          }
      }

      // OK, success. Delete the old content.
      rmrf(fd, away);
      return true;
    } else {
      // Only one of CREATE or MODIFY is specified, so we need to verify non-atomically that the
      // corresponding precondition (must-not-exist or must-exist, respectively) is held.
      if (has(mode, WriteMode::CREATE)) {
        struct stat stats;
        KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd.get(), toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
          case ENOENT:
          case ENOTDIR:
            break;  // doesn't exist; continue
          default:
            KJ_FAIL_SYSCALL("fstatat(fd, toPath)", error, toPath) { return false; }
        } else {
          return false;  // already exists; fail
        }
      } else if (has(mode, WriteMode::MODIFY)) {
        struct stat stats;
        KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd.get(), toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
          case ENOENT:
          case ENOTDIR:
            return false;  // doesn't exist; fail
          default:
            KJ_FAIL_SYSCALL("fstatat(fd, toPath)", error, toPath) { return false; }
        } else {
          // already exists; continue
        }
      } else {
        // Neither CREATE nor MODIFY.
        return false;
      }

      // Start over in create-and-modify mode.
      return tryCommitReplacement(toPath, fromDirFd, fromPath,
                                  WriteMode::CREATE | WriteMode::MODIFY,
                                  errorReason);
    }
  }